

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O0

void __thiscall ScalarEstimator::setProperty(ScalarEstimator *this,Property *p,double d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  double d_local;
  Property *p_local;
  ScalarEstimator *this_local;
  
  if (*p == 1) {
    this->aDistRange[0] = d;
    if (this->aDist != (double *)0x0) {
      operator_delete__(this->aDist);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->nDist;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar4);
    this->aDist = pdVar5;
    this->dDistOffset = this->aDistRange[0];
    this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)this->nDist;
  }
  else if (*p == 2) {
    this->aDistRange[1] = d;
    if (this->aDist != (double *)0x0) {
      operator_delete__(this->aDist);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->nDist;
    uVar4 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar4);
    this->aDist = pdVar5;
    this->dDistOffset = this->aDistRange[0];
    this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)this->nDist;
  }
  else if (*p == 3) {
    if (0.0 < d) {
      this->nDist = (int)d;
    }
    if (this->aDist != (double *)0x0) {
      operator_delete__(this->aDist);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)this->nDist;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar4);
    this->aDist = pdVar5;
    this->dDistOffset = this->aDistRange[0];
    this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)this->nDist;
  }
  return;
}

Assistant:

void ScalarEstimator::setProperty(const Property& p, double d)
{
	if( p == EST_DIST_MIN ) {
		aDistRange[0] = d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	} else if ( p == EST_DIST_MAX ) {
		aDistRange[1] = d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	} else if ( p == EST_DIST_BINS ) {
		if( d>0 )
			nDist = (int) d;
		delete[] aDist;
		aDist = new double[nDist];
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
}